

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

CYCLIC_REFRESH * av1_cyclic_refresh_alloc(int mi_rows,int mi_cols)

{
  CYCLIC_REFRESH *pCVar1;
  int8_t *piVar2;
  undefined4 in_ESI;
  undefined4 in_EDI;
  CYCLIC_REFRESH *cr;
  size_t in_stack_fffffffffffffff8;
  
  pCVar1 = (CYCLIC_REFRESH *)aom_calloc(in_stack_fffffffffffffff8,CONCAT44(in_EDI,in_ESI));
  if (pCVar1 == (CYCLIC_REFRESH *)0x0) {
    pCVar1 = (CYCLIC_REFRESH *)0x0;
  }
  else {
    piVar2 = (int8_t *)aom_calloc(in_stack_fffffffffffffff8,CONCAT44(in_EDI,in_ESI));
    pCVar1->map = piVar2;
    pCVar1->counter_encode_maxq_scene_change = 0;
    pCVar1->percent_refresh_adjustment = 5;
    pCVar1->rate_ratio_qdelta_adjustment = 0.25;
    if (pCVar1->map == (int8_t *)0x0) {
      av1_cyclic_refresh_free((CYCLIC_REFRESH *)0x6f8ccd);
      pCVar1 = (CYCLIC_REFRESH *)0x0;
    }
  }
  return pCVar1;
}

Assistant:

CYCLIC_REFRESH *av1_cyclic_refresh_alloc(int mi_rows, int mi_cols) {
  CYCLIC_REFRESH *const cr = aom_calloc(1, sizeof(*cr));
  if (cr == NULL) return NULL;

  cr->map = aom_calloc(mi_rows * mi_cols, sizeof(*cr->map));
  cr->counter_encode_maxq_scene_change = 0;
  cr->percent_refresh_adjustment = 5;
  cr->rate_ratio_qdelta_adjustment = 0.25;
  if (cr->map == NULL) {
    av1_cyclic_refresh_free(cr);
    return NULL;
  }
  return cr;
}